

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __thiscall
cs222::Parser::next(Parser *this)

{
  string *line;
  size_t *lineNumber;
  bitset<6UL> *flags;
  size_type *psVar1;
  istream iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  ulong uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  Format FVar9;
  int iVar10;
  istream *piVar11;
  Instruction *pIVar12;
  const_iterator cVar13;
  long lVar14;
  _Alloc_hider _Var15;
  char *pcVar16;
  Parser *in_RSI;
  pointer this_00;
  char *pcVar17;
  string token;
  string operation;
  string lookahead;
  string comment;
  string operandsToken;
  string label;
  Operand_pair temp;
  smatch match;
  string local_228;
  Operand_pair operands;
  stringstream sstream;
  ios_base local_138 [264];
  
  if ((in_RSI->nextInstruction)._M_t.
      super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
      super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    this->_vptr_Parser =
         (_func_int **)
         (in_RSI->nextInstruction)._M_t.
         super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
         super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl;
    (in_RSI->nextInstruction)._M_t.
    super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
    super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    return (unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>)this;
  }
  piVar11 = in_RSI->inputStream;
  line = &in_RSI->line;
  cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar11 + -0x18) + (char)piVar11);
  piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                      (piVar11,(string *)line,cVar6);
  if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) {
LAB_00124072:
    this->_vptr_Parser = (_func_int **)0x0;
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  in_RSI->lineNumber = in_RSI->lineNumber + 1;
  lineNumber = &in_RSI->lineNumber;
  flags = &in_RSI->flags;
  (in_RSI->flags).super__Base_bitset<1UL>._M_w = 0;
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands,"^\\s*$",0x10);
    __s._M_current = (in_RSI->line)._M_dataplus._M_p;
    _sstream = (pointer)0x0;
    bVar7 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(__s._M_current + (in_RSI->line)._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&sstream,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands
                       ,0);
    if (_sstream != (pointer)0x0) {
      operator_delete(_sstream,-(long)_sstream);
    }
    if (!bVar7) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands);
      break;
    }
    piVar11 = in_RSI->inputStream;
    cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar11 + -0x18) + (char)piVar11);
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (piVar11,(string *)line,cVar6);
    iVar2 = piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20];
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands);
  } while (((byte)iVar2 & 5) == 0);
  if (((byte)in_RSI->inputStream[*(long *)(*(long *)in_RSI->inputStream + -0x18) + 0x20] & 5) != 0)
  goto LAB_00124072;
  std::__cxx11::stringstream::stringstream((stringstream *)&sstream,(string *)line,_S_out|_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&token,0,(char *)0x0,0x136783);
  std::operator>>((istream *)&sstream,(string *)&token);
  if (*token._M_dataplus._M_p == '.') {
    pIVar12 = (Instruction *)operator_new(0x140);
    Instruction::Instruction(pIVar12,lineNumber,line);
    this->_vptr_Parser = (_func_int **)pIVar12;
    goto LAB_0012489e;
  }
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  operation._M_dataplus._M_p = (pointer)&operation.field_2;
  operation._M_string_length = 0;
  operation.field_2._M_local_buf[0] = '\0';
  operandsToken._M_dataplus._M_p = (pointer)&operandsToken.field_2;
  operandsToken._M_string_length = 0;
  operandsToken.field_2._M_local_buf[0] = '\0';
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&operands);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  bVar7 = isDirective(&token);
  bVar8 = true;
  if ((bVar7) || (bVar7 = isOperation(&token), bVar7)) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_228,(ulong)&token);
    bVar8 = isOperation(&local_228);
    bVar7 = true;
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2)) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 == false) {
    parseLabel(in_RSI,&token,&label);
    std::__cxx11::string::_M_replace((ulong)&token,0,(char *)token._M_string_length,0x136783);
    std::operator>>((istream *)&sstream,(string *)&token);
  }
  parseOperation(in_RSI,&token,&operation);
  bVar7 = isOperation(&operation);
  if (bVar7) {
    cVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)OpTable_abi_cxx11_,&operation);
    FVar9 = Operation::getValidFormat
                      ((Operation *)
                       ((long)cVar13.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                              ._M_cur + 0x28));
    if ((FVar9 != FORMAT_1) &&
       (iVar10 = std::__cxx11::string::compare((char *)&operation), iVar10 != 0)) goto LAB_00124279;
    std::__cxx11::string::_M_replace((ulong)&token,0,(char *)token._M_string_length,0x136783);
    std::operator>>((istream *)&sstream,(string *)&token);
    std::__cxx11::string::_M_assign((string *)&comment);
    flushRestToToken(&sstream,&token);
    std::__cxx11::string::_M_append((char *)&comment,(ulong)token._M_dataplus._M_p);
    pIVar12 = (Instruction *)operator_new(0x140);
    Instruction::Instruction
              (pIVar12,lineNumber,line,&label,&operation,&operands.first,&operands.second,
               &operandsToken,&comment,flags);
    this->_vptr_Parser = (_func_int **)pIVar12;
  }
  else {
LAB_00124279:
    lookahead._M_dataplus._M_p = (pointer)&lookahead.field_2;
    lookahead._M_string_length = 0;
    lookahead.field_2._M_local_buf[0] = '\0';
    lVar14 = std::istream::tellg();
    if (lVar14 != -1) {
      std::__cxx11::string::substr((ulong)&temp,(ulong)line);
      std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
      if ((size_type *)temp.first._0_8_ != &temp.first.value._M_string_length) {
        operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
      }
    }
    sVar5 = lookahead._M_string_length;
    _Var4._M_p = lookahead._M_dataplus._M_p;
    _Var15._M_p = lookahead._M_dataplus._M_p;
    if (0 < (long)lookahead._M_string_length >> 2) {
      _Var15._M_p = lookahead._M_dataplus._M_p + (lookahead._M_string_length & 0xfffffffffffffffc);
      lVar14 = ((long)lookahead._M_string_length >> 2) + 1;
      pcVar17 = lookahead._M_dataplus._M_p + 3;
      do {
        iVar10 = isspace((int)pcVar17[-3]);
        if (iVar10 == 0) {
          pcVar17 = pcVar17 + -3;
          goto LAB_001244d3;
        }
        iVar10 = isspace((int)pcVar17[-2]);
        if (iVar10 == 0) {
          pcVar17 = pcVar17 + -2;
          goto LAB_001244d3;
        }
        iVar10 = isspace((int)pcVar17[-1]);
        if (iVar10 == 0) {
          pcVar17 = pcVar17 + -1;
          goto LAB_001244d3;
        }
        iVar10 = isspace((int)*pcVar17);
        if (iVar10 == 0) goto LAB_001244d3;
        lVar14 = lVar14 + -1;
        pcVar17 = pcVar17 + 4;
      } while (1 < lVar14);
    }
    pcVar16 = _Var4._M_p + sVar5;
    lVar14 = (long)pcVar16 - (long)_Var15._M_p;
    if (lVar14 == 1) {
LAB_001244b5:
      iVar10 = isspace((int)*_Var15._M_p);
      pcVar17 = pcVar16;
      if (iVar10 == 0) {
        pcVar17 = _Var15._M_p;
      }
    }
    else if (lVar14 == 2) {
LAB_001244a1:
      iVar10 = isspace((int)*_Var15._M_p);
      pcVar17 = _Var15._M_p;
      if (iVar10 != 0) {
        _Var15._M_p = _Var15._M_p + 1;
        goto LAB_001244b5;
      }
    }
    else {
      pcVar17 = pcVar16;
      if ((lVar14 == 3) && (iVar10 = isspace((int)*_Var15._M_p), pcVar17 = _Var15._M_p, iVar10 != 0)
         ) {
        _Var15._M_p = _Var15._M_p + 1;
        goto LAB_001244a1;
      }
    }
LAB_001244d3:
    std::__cxx11::string::substr((ulong)&temp,(ulong)&lookahead);
    std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
    psVar1 = &temp.first.value._M_string_length;
    if ((size_type *)temp.first._0_8_ != psVar1) {
      operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
    }
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,
               "^\\=?C\'[A-Za-z0-9\\s]+\'",0x10);
    bVar7 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )lookahead._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(lookahead._M_dataplus._M_p + lookahead._M_string_length),&match,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp);
    if (bVar7) {
      this_00 = match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48) {
        this_00 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      if (match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_00 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      std::__cxx11::sub_match::operator_cast_to_string((string_type *)&temp,(sub_match *)this_00);
      std::__cxx11::string::operator=((string *)&token,(string *)&temp);
      if ((size_type *)temp.first._0_8_ != psVar1) {
        operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
      }
      std::istream::seekg((long)&sstream,
                          ((int)pcVar17 - (int)_Var4._M_p) + (int)token._M_string_length);
    }
    else {
      advanceToken(&sstream,&token);
    }
    std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&temp);
    bVar7 = parseOperands(in_RSI,&token,&temp);
    if (bVar7) {
      std::__cxx11::string::_M_assign((string *)&operandsToken);
      std::pair<cs222::Operand,_cs222::Operand>::operator=(&operands,&temp);
      bVar7 = isOperation(&operation);
      if (bVar7) {
        cVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)OpTable_abi_cxx11_,&operation);
        FVar9 = Operation::getValidFormat
                          ((Operation *)
                           ((long)cVar13.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                                  ._M_cur + 0x28));
        if ((FVar9 == FORMAT_3_4) &&
           (uVar3 = (flags->super__Base_bitset<1UL>)._M_w, (uVar3 & 0x30) == 0)) {
          (flags->super__Base_bitset<1UL>)._M_w = uVar3 | 0x30;
        }
      }
      advanceToken(&sstream,&token);
    }
    std::__cxx11::string::_M_assign((string *)&comment);
    flushRestToToken(&sstream,&token);
    std::__cxx11::string::_M_append((char *)&comment,(ulong)token._M_dataplus._M_p);
    pIVar12 = (Instruction *)operator_new(0x140);
    Instruction::Instruction
              (pIVar12,lineNumber,line,&label,&operation,&operands.first,&operands.second,
               &operandsToken,&comment,flags);
    this->_vptr_Parser = (_func_int **)pIVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp.second.value._M_dataplus._M_p != &temp.second.value.field_2) {
      operator_delete(temp.second.value._M_dataplus._M_p,
                      temp.second.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp.first.value._M_dataplus._M_p != &temp.first.value.field_2) {
      operator_delete(temp.first.value._M_dataplus._M_p,
                      temp.first.value.field_2._M_allocated_capacity + 1);
    }
    if (match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lookahead._M_dataplus._M_p != &lookahead.field_2) {
      operator_delete(lookahead._M_dataplus._M_p,
                      CONCAT71(lookahead.field_2._M_allocated_capacity._1_7_,
                               lookahead.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operands.second.value._M_dataplus._M_p != &operands.second.value.field_2) {
    operator_delete(operands.second.value._M_dataplus._M_p,
                    operands.second.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operands.first.value._M_dataplus._M_p != &operands.first.value.field_2) {
    operator_delete(operands.first.value._M_dataplus._M_p,
                    operands.first.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operandsToken._M_dataplus._M_p != &operandsToken.field_2) {
    operator_delete(operandsToken._M_dataplus._M_p,
                    CONCAT71(operandsToken.field_2._M_allocated_capacity._1_7_,
                             operandsToken.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operation._M_dataplus._M_p != &operation.field_2) {
    operator_delete(operation._M_dataplus._M_p,
                    CONCAT71(operation.field_2._M_allocated_capacity._1_7_,
                             operation.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)label._M_dataplus._M_p != &label.field_2) {
    operator_delete(label._M_dataplus._M_p,
                    CONCAT71(label.field_2._M_allocated_capacity._1_7_,label.field_2._M_local_buf[0]
                            ) + 1);
  }
LAB_0012489e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)token._M_dataplus._M_p != &token.field_2) {
    operator_delete(token._M_dataplus._M_p,
                    CONCAT71(token.field_2._M_allocated_capacity._1_7_,token.field_2._M_local_buf[0]
                            ) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
  std::ios_base::~ios_base(local_138);
  return (unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>)this;
}

Assistant:

std::unique_ptr<Instruction> Parser::next()
    {
        if (nextInstruction) {
            return std::move(nextInstruction);
        }

        if (std::getline(inputStream, line))
        {
            lineNumber += 1;
            flags.reset();

            // Ignore empty lines
            while (
                    std::regex_match(line, std::regex("^\\s*$")) &&
                    std::getline(inputStream, line)
                    );

            // Reached end of stream?
            if (!inputStream)
            {
                return nullptr;
            }

            std::stringstream sstream(line);
            std::string token;

            advanceToken(sstream, token);
            if (token[0] == '.') // Comment line?
            {
                return std::make_unique<Instruction>(lineNumber, line);
            }

            std::string label;
            std::string operation;
            std::string operandsToken;
            Operand_pair operands;
            std::string comment;

            if (!(
                        isDirective(token) ||
                        isOperation(token) ||
                        isOperation(token.substr(1))))
            {
                parseLabel(token, label);
                advanceToken(sstream, token);
            }

            parseOperation(token, operation);

            if (isOperation(operation))
            {
                Instruction::Format fmt =
                    OpTable.find(operation)->second.getValidFormat();
                if (fmt == Instruction::FORMAT_1 || operation == "RSUB")
                {
                    advanceToken(sstream, token);
                    comment = token;
                    flushRestToToken(sstream, token);
                    comment += token;
                    return std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            operands.first, operands.second,
                            operandsToken, comment, flags);
                }
            }

            // Corner case: character constants
            // and literals can have spaces
            std::string lookahead;
            size_t lookahead_start = sstream.tellg();
            if (lookahead_start != -1)
            {
                lookahead = line.substr(lookahead_start);
            }
            size_t first_non_space = std::distance(
                    lookahead.begin(),
                    find_if_not(lookahead.begin(), lookahead.end(), isspace));
            lookahead = lookahead.substr(first_non_space);
            std::smatch match;
            if (std::regex_match(
                        lookahead,
                        match,
                        std::regex("^\\=?C'[A-Za-z0-9\\s]+'")))
            {
                token = match[0];
                sstream.seekg(
                        first_non_space + token.length(), std::ios_base::cur);
            }
            else
            {
                advanceToken(sstream, token);
            }

            Operand_pair temp;
            if (parseOperands(token, temp))
            {
                operandsToken = token;
                operands = temp;
                // SIC/XE Simple Addressing
                if (isOperation(operation))
                    {
                    Instruction::Format fmt =
                        cs222::OpTable.find(operation)->second.getValidFormat();
                    if (fmt == Instruction::FORMAT_3_4 && !(
                                flags.test(Instruction::FLAG_INDIRECT) ||
                                flags.test(Instruction::FLAG_IMMEDIATE)))
                    {
                        flags.set(Instruction::FLAG_INDIRECT);
                        flags.set(Instruction::FLAG_IMMEDIATE);
                    }
                }
                advanceToken(sstream, token);
            }

            comment = token;
            flushRestToToken(sstream, token);
            comment += token;

            return std::make_unique<Instruction>(
                    lineNumber, line, label, operation,
                    operands.first, operands.second,
                    operandsToken, comment, flags);
        }

        return nullptr;
    }